

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O2

int __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::remove
          (mem_cache<cppcms::impl::process_settings> *this,char *__filename)

{
  int extraout_EAX;
  pointer p;
  wrlock_guard lock;
  _Head_base<0UL,_cppcms::impl::shared_mutex_*,_false> local_18;
  
  local_18._M_head_impl =
       (this->access_lock)._M_t.
       super___uniq_ptr_impl<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
       ._M_t.
       super__Tuple_impl<0UL,_cppcms::impl::shared_mutex_*,_std::default_delete<cppcms::impl::shared_mutex>_>
       .super__Head_base<0UL,_cppcms::impl::shared_mutex_*,_false>._M_head_impl;
  shared_mutex::wrlock(local_18._M_head_impl);
  p.p_ = details::
         basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>
         ::find<std::__cxx11::string>
                   ((basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>
                     *)&this->primary,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename)
  ;
  if (p.p_ != (iterator)0x0) {
    delete_node(this,p);
  }
  shared_mutex::unique_guard::~unique_guard((unique_guard *)&local_18);
  return extraout_EAX;
}

Assistant:

virtual void remove(std::string const &key)
	{
		wrlock_guard lock(*access_lock);
		pointer p=primary.find(key);
		if(p==primary.end())
			return;
		delete_node(p);
	}